

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

Float pbrt::MISWeight(Integrator *integrator,Vertex *lightVertices,Vertex *cameraVertices,
                     Vertex *sampled,int s,int t,LightSamplerHandle *lightSampler)

{
  bool *pbVar1;
  Frame *pFVar2;
  byte *pbVar3;
  Vertex *this;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined8 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [32];
  undefined1 uVar12;
  bool bVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uintptr_t uVar18;
  undefined4 uVar20;
  undefined8 uVar19;
  undefined4 uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [24];
  undefined1 auVar25 [32];
  float fVar26;
  Float *pFVar27;
  Vertex *next;
  Vertex *prev;
  Float *pFVar28;
  Vertex *v;
  uint *puVar29;
  ulong uVar30;
  ulong uVar31;
  Vertex *pVVar32;
  Vertex *this_00;
  Float *pFVar33;
  Float *pFVar34;
  ulong uVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  Float FVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  Float FVar44;
  float fVar45;
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined2 local_3a8;
  undefined1 local_3a6;
  undefined2 local_3a4;
  undefined1 local_3a2;
  float local_3a0;
  float local_39c;
  Float *local_398;
  bool *local_390;
  uintptr_t local_380;
  bool *local_378;
  undefined4 local_35c;
  undefined5 local_358;
  undefined3 uStack_353;
  undefined5 uStack_350;
  undefined5 local_340;
  undefined3 uStack_33b;
  undefined5 uStack_338;
  Float local_320;
  Float local_31c;
  Float local_318;
  undefined1 local_308 [16];
  undefined3 local_2eb;
  undefined5 uStack_2e8;
  undefined3 local_2db;
  undefined5 uStack_2d8;
  undefined1 local_2a8 [32];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_268;
  undefined1 local_260 [4];
  undefined1 local_25c [16];
  undefined1 local_248 [24];
  undefined1 auStack_230 [40];
  undefined1 auStack_208 [24];
  undefined1 local_148 [4];
  undefined1 local_144 [16];
  undefined1 local_130 [24];
  undefined1 auStack_118 [40];
  undefined1 auStack_f0 [24];
  undefined1 auVar38 [16];
  
  if (t + s == 2) {
    return 1.0;
  }
  uVar35 = (ulong)(uint)s;
  uVar30 = (ulong)(uint)t;
  auVar37 = ZEXT816(0) << 0x40;
  local_308 = ZEXT816(0);
  auVar42 = ZEXT464(0) << 0x40;
  local_130 = auVar42._0_24_;
  auStack_118 = auVar42._0_40_;
  auStack_f0 = (undefined1  [24])0x0;
  local_340 = 0;
  uStack_33b = 0;
  uStack_338 = 0;
  this = lightVertices + (uVar35 - 1);
  next = (Vertex *)0x0;
  if (0 < s) {
    next = this;
  }
  pVVar32 = cameraVertices + (uVar30 - 1);
  this_00 = (Vertex *)0x0;
  if (0 < t) {
    this_00 = pVVar32;
  }
  prev = lightVertices + (uVar35 - 2);
  if (s < 2) {
    prev = (Vertex *)0x0;
  }
  v = cameraVertices + (uVar30 - 2);
  if (t < 2) {
    v = (Vertex *)0x0;
  }
  local_144 = auVar37;
  if (s == 1) {
    uVar18 = (sampled->bsdf).bxdf.
             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
             .bits;
    pFVar2 = &(sampled->bsdf).shadingFrame;
    auVar24._0_12_ = *(undefined1 (*) [12])&pFVar2->x;
    auVar24._12_12_ = *(undefined1 (*) [12])&pFVar2->y;
    fVar47 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
    fVar26 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar25._0_12_ = *(undefined1 (*) [12])&pFVar2->x;
    auVar25._12_12_ = *(undefined1 (*) [12])&pFVar2->y;
    auVar25._24_4_ = (pFVar2->z).super_Tuple3<pbrt::Vector3,_float>.x;
    auVar25._28_4_ = (pFVar2->z).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar45 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_2d8 = (undefined5)
                 ((ulong)*(undefined8 *)
                          ((long)&(sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) >>
                 0x18);
    uVar16 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar20 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
    local_2db = (undefined3)((uint)uVar20 >> 8);
    uVar14 = *(undefined2 *)&sampled->field_0x151;
    uVar12 = sampled->field_0x153;
    uVar4 = sampled->pdfFwd;
    uVar8 = sampled->pdfRev;
    auVar23._4_4_ = uVar8;
    auVar23._0_4_ = uVar4;
    uVar15 = *(undefined4 *)&sampled->field_0x15c;
    local_358 = 0;
    uStack_353 = 0;
    uStack_350 = 0;
    local_25c = auVar37;
    local_248 = local_130;
    auStack_230 = auStack_118;
    auStack_208 = auStack_f0;
    if (this == (Vertex *)0x0) {
      FVar44 = 1.0;
      local_380 = 0;
      local_308._0_8_ = 0;
      local_288 = 0x3f800000;
      uStack_280 = 0;
      uStack_278 = 0x3f800000;
      uStack_270 = 0;
      local_39c = 1.0;
    }
    else {
      memcpy(local_260,this,0x118);
      FVar44 = auVar37._0_4_;
      local_288._0_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
      local_288._4_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
      uStack_280 = *(undefined8 *)
                    &lightVertices[uVar35 - 1].bsdf.shadingFrame.x.
                     super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_278._0_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
      uStack_278._4_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_270._0_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
      uStack_270._4_4_ =
           lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
      local_380 = lightVertices[uVar35 - 1].bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits;
      local_39c = lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      uStack_350 = (undefined5)
                   ((ulong)*(undefined8 *)
                            ((long)&lightVertices[uVar35 - 1].bsdf.ng.
                                    super_Tuple3<pbrt::Normal3,_float>.y + 1) >> 0x18);
      uVar19._0_4_ = lightVertices[uVar35 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar19._4_4_ = lightVertices[uVar35 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y;
      local_358 = (undefined5)uVar19;
      uStack_353 = (undefined3)((uint)uVar19._4_4_ >> 8);
      local_3a6 = lightVertices[uVar35 - 1].field_0x153;
      local_3a8 = *(undefined2 *)&lightVertices[uVar35 - 1].field_0x151;
      local_308._0_4_ = lightVertices[uVar35 - 1].pdfFwd;
      local_308._4_4_ = lightVertices[uVar35 - 1].pdfRev;
      local_35c = *(undefined4 *)&lightVertices[uVar35 - 1].field_0x15c;
      memmove(this,sampled,0x118);
      local_2a8._0_8_ = auVar24._0_8_;
      local_2a8._8_8_ = auVar24._8_8_;
      local_2a8._16_8_ = auVar24._16_8_;
      lightVertices[uVar35 - 1].bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits = uVar18;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)local_2a8._0_4_;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)local_2a8._4_4_;
      *(undefined8 *)
       &lightVertices[uVar35 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
           local_2a8._8_8_;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)local_2a8._16_4_;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
           (float)local_2a8._20_4_;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = fVar47;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = fVar26;
      lightVertices[uVar35 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = fVar45;
      auVar23._8_8_ = 0;
      lightVertices[uVar35 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar16;
      lightVertices[uVar35 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar20;
      *(ulong *)((long)&lightVertices[uVar35 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y + 1)
           = CONCAT53(uStack_2d8,local_2db);
      *(undefined2 *)&lightVertices[uVar35 - 1].field_0x151 = uVar14;
      lightVertices[uVar35 - 1].field_0x153 = uVar12;
      uVar7 = vmovlps_avx(auVar23);
      lightVertices[uVar35 - 1].pdfFwd = (Float)(int)uVar7;
      lightVertices[uVar35 - 1].pdfRev = (Float)(int)((ulong)uVar7 >> 0x20);
      *(undefined4 *)&lightVertices[uVar35 - 1].field_0x15c = uVar15;
      local_3a0 = fVar45;
      local_318 = (Float)uVar4;
      local_2a8 = auVar25;
    }
    local_308._8_8_ = 0;
    memcpy(local_148,local_260,0x118);
    pVVar32 = next;
  }
  else {
    if (t != 1) {
      FVar44 = 1.0;
      pVVar32 = (Vertex *)0x0;
      local_380 = 0;
      local_288 = 0x3f800000;
      uStack_280 = 0;
      uStack_278 = 0x3f800000;
      uStack_270 = 0;
      local_39c = 1.0;
      goto LAB_004407ec;
    }
    uVar18 = (sampled->bsdf).bxdf.
             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
             .bits;
    auVar11._0_12_ = *(undefined1 (*) [12])&(sampled->bsdf).shadingFrame.x;
    auVar11._12_12_ = *(undefined1 (*) [12])&(sampled->bsdf).shadingFrame.y;
    auVar11._24_4_ = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar11._28_4_ = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
    fVar45 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
    uStack_2e8 = (undefined5)
                 ((ulong)*(undefined8 *)
                          ((long)&(sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) >>
                 0x18);
    uVar17 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar21 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
    local_2eb = (undefined3)((uint)uVar21 >> 8);
    uVar14 = *(undefined2 *)&sampled->field_0x151;
    uVar12 = sampled->field_0x153;
    uVar5 = sampled->pdfFwd;
    uVar9 = sampled->pdfRev;
    auVar37._4_4_ = uVar9;
    auVar37._0_4_ = uVar5;
    uVar15 = *(undefined4 *)&sampled->field_0x15c;
    local_25c = ZEXT816(0);
    auVar42 = ZEXT464(0) << 0x20;
    local_358 = 0;
    uStack_353 = 0;
    uStack_350 = 0;
    local_248 = auVar42._0_24_;
    auStack_230 = auVar42._0_40_;
    auStack_208 = (undefined1  [24])0x0;
    if (pVVar32 == (Vertex *)0x0) {
      FVar44 = 1.0;
      local_308 = ZEXT416(0) << 0x20;
      local_380 = 0;
      local_288 = 0x3f800000;
      uStack_280 = 0;
      uStack_278 = 0x3f800000;
      uStack_270 = 0;
      local_39c = 1.0;
    }
    else {
      FVar44 = auVar11._0_4_;
      memcpy(local_260,pVVar32,0x118);
      local_288._0_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
      local_288._4_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
      uStack_280 = *(undefined8 *)
                    &cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.
                     super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_278._0_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
      uStack_278._4_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_270._0_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
      uStack_270._4_4_ =
           cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
      local_380 = cameraVertices[uVar30 - 1].bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                  .bits;
      local_39c = cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.
                  z;
      uStack_350 = (undefined5)
                   ((ulong)*(undefined8 *)
                            ((long)&cameraVertices[uVar30 - 1].bsdf.ng.
                                    super_Tuple3<pbrt::Normal3,_float>.y + 1) >> 0x18);
      uVar7._0_4_ = cameraVertices[uVar30 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar7._4_4_ = cameraVertices[uVar30 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y;
      local_358 = (undefined5)uVar7;
      uStack_353 = (undefined3)((uint)uVar7._4_4_ >> 8);
      local_3a6 = cameraVertices[uVar30 - 1].field_0x153;
      local_3a8 = *(undefined2 *)&cameraVertices[uVar30 - 1].field_0x151;
      uVar6 = cameraVertices[uVar30 - 1].pdfFwd;
      uVar10 = cameraVertices[uVar30 - 1].pdfRev;
      local_308._4_4_ = uVar10;
      local_308._0_4_ = uVar6;
      local_35c = *(undefined4 *)&cameraVertices[uVar30 - 1].field_0x15c;
      local_308._8_8_ = 0;
      memmove(pVVar32,sampled,0x118);
      local_2a8._0_8_ = auVar11._0_8_;
      local_2a8._8_8_ = auVar11._8_8_;
      local_2a8._16_8_ = auVar11._16_8_;
      cameraVertices[uVar30 - 1].bsdf.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits = uVar18;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)local_2a8._0_4_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)local_2a8._4_4_;
      *(undefined8 *)
       &cameraVertices[uVar30 - 1].bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
           local_2a8._8_8_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)local_2a8._16_4_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
           (float)local_2a8._20_4_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)auVar11._24_4_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)auVar11._28_4_;
      cameraVertices[uVar30 - 1].bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = fVar45;
      auVar37._8_8_ = 0;
      cameraVertices[uVar30 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar17;
      cameraVertices[uVar30 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar21;
      *(ulong *)((long)&cameraVertices[uVar30 - 1].bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y + 1)
           = CONCAT53(uStack_2e8,local_2eb);
      *(undefined2 *)&cameraVertices[uVar30 - 1].field_0x151 = uVar14;
      cameraVertices[uVar30 - 1].field_0x153 = uVar12;
      uVar7 = vmovlps_avx(auVar37);
      cameraVertices[uVar30 - 1].pdfFwd = (Float)(int)uVar7;
      cameraVertices[uVar30 - 1].pdfRev = (Float)(int)((ulong)uVar7 >> 0x20);
      *(undefined4 *)&cameraVertices[uVar30 - 1].field_0x15c = uVar15;
      local_3a0 = fVar45;
      local_318 = (Float)uVar5;
      local_2a8 = auVar11;
    }
    memcpy(local_148,local_260,0x118);
    pVVar32 = this_00;
  }
  local_3a2 = local_3a6;
  local_3a4 = local_3a8;
  local_340 = local_358;
  uStack_33b = uStack_353;
  uStack_338 = uStack_350;
LAB_004407ec:
  if (this_00 == (Vertex *)0x0) {
    local_390 = (bool *)0x0;
  }
  else {
    local_3a0._0_1_ = this_00->delta;
    local_390 = &this_00->delta;
    this_00->delta = false;
  }
  if (next == (Vertex *)0x0) {
    local_378 = (bool *)0x0;
  }
  else {
    bVar13 = next->delta;
    local_378 = &next->delta;
    next->delta = false;
    local_2a8[0] = bVar13;
  }
  if (this_00 == (Vertex *)0x0) {
    pFVar33 = (Float *)0x0;
  }
  else {
    if (s < 1) {
      local_268.bits =
           (lightSampler->
           super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
           ).bits;
      FVar41 = Vertex::PdfLightOrigin
                         (this_00,&integrator->infiniteLights,v,(LightSamplerHandle *)&local_268);
    }
    else {
      FVar41 = Vertex::PDF(this,integrator,prev,this_00);
    }
    pFVar33 = &this_00->pdfRev;
    FVar44 = *pFVar33;
    *pFVar33 = FVar41;
    local_318 = FVar44;
  }
  if (v == (Vertex *)0x0) {
    pFVar34 = (Float *)0x0;
  }
  else {
    if (s < 1) {
      FVar41 = Vertex::PdfLight(this_00,integrator,v);
    }
    else {
      FVar41 = Vertex::PDF(this_00,integrator,this,v);
    }
    pFVar34 = &v->pdfRev;
    FVar44 = *pFVar34;
    *pFVar34 = FVar41;
    local_31c = FVar44;
  }
  if (next == (Vertex *)0x0) {
    local_398 = (Float *)0x0;
  }
  else {
    FVar41 = Vertex::PDF(this_00,integrator,v,next);
    FVar44 = next->pdfRev;
    local_398 = &next->pdfRev;
    next->pdfRev = FVar41;
    local_320 = FVar44;
  }
  if (prev == (Vertex *)0x0) {
    pFVar27 = (Float *)0x0;
  }
  else {
    FVar41 = Vertex::PDF(next,integrator,this_00,prev);
    FVar44 = prev->pdfRev;
    pFVar27 = &prev->pdfRev;
    prev->pdfRev = FVar41;
  }
  auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
  if (1 < t) {
    auVar48._8_4_ = 0x3f800000;
    auVar48._0_8_ = 0x3f8000003f800000;
    auVar48._12_4_ = 0x3f800000;
    fVar45 = 1.0;
    uVar31 = uVar30 + 1;
    pFVar28 = &cameraVertices[uVar30 - 1].pdfFwd;
    do {
      uVar30 = *(ulong *)pFVar28;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar30;
      uVar22 = vcmpps_avx512vl(auVar49,ZEXT816(0) << 0x40,4);
      auVar37 = vblendmps_avx512vl(auVar48,auVar49);
      bVar13 = (bool)((byte)uVar22 & 1);
      auVar38._0_4_ = (float)((uint)bVar13 * auVar37._0_4_ | (uint)!bVar13 * (int)uVar30);
      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * (int)(uVar30 >> 0x20);
      auVar38._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar37._8_4_;
      auVar38._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar37._12_4_;
      auVar42._0_16_ = auVar38;
      auVar37 = vmovshdup_avx(auVar38);
      fVar45 = fVar45 * (auVar37._0_4_ / auVar38._0_4_);
      if (*(bool *)(pFVar28 + -1) == false) {
        fVar47 = auVar43._0_4_ + fVar45;
        auVar40._16_48_ = auVar42._16_48_;
        auVar40._0_16_ = ZEXT416((uint)fVar47);
        auVar42._4_60_ = auVar40._4_60_;
        auVar42._0_4_ =
             (float)((uint)(*(byte *)(pFVar28 + -0x59) & 1) * (int)auVar43._0_4_ +
                    (uint)!(bool)(*(byte *)(pFVar28 + -0x59) & 1) * (int)fVar47);
        auVar43 = ZEXT1664(auVar42._0_16_);
      }
      uVar31 = uVar31 - 1;
      pFVar28 = pFVar28 + -0x58;
    } while (2 < uVar31);
  }
  fVar45 = auVar43._0_4_;
  if (0 < s) {
    auVar50._8_4_ = 0x3f800000;
    auVar50._0_8_ = 0x3f8000003f800000;
    auVar50._12_4_ = 0x3f800000;
    fVar47 = 1.0;
    lVar36 = uVar35 + 1;
    pFVar28 = &lightVertices[uVar35 - 1].pdfFwd;
    do {
      fVar45 = auVar43._0_4_;
      uVar30 = *(ulong *)pFVar28;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar30;
      uVar35 = vcmpps_avx512vl(auVar46,ZEXT816(0) << 0x40,4);
      auVar43._16_48_ = auVar42._16_48_;
      auVar37 = vblendmps_avx512vl(auVar50,auVar46);
      bVar13 = (bool)((byte)uVar35 & 1);
      auVar39._0_4_ = (float)((uint)bVar13 * auVar37._0_4_ | (uint)!bVar13 * (int)uVar30);
      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * (int)(uVar30 >> 0x20);
      auVar39._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar37._8_4_;
      auVar39._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar37._12_4_;
      auVar37 = vmovshdup_avx(auVar39);
      fVar47 = fVar47 * (auVar37._0_4_ / auVar39._0_4_);
      if (lVar36 == 2) {
        if (((lightVertices->type != Light) ||
            (puVar29 = (uint *)((ulong)(lightVertices->field_2).ei.field_0 & 0xffffffffffff),
            puVar29 == (uint *)0x0)) || (1 < *puVar29)) {
          fVar45 = (float)((uint)(*(bool *)(pFVar28 + -1) & 1) * (int)fVar45 +
                          (uint)!(bool)(*(bool *)(pFVar28 + -1) & 1) * (int)(fVar45 + fVar47));
        }
        break;
      }
      pbVar3 = (byte *)(pFVar28 + -0x59);
      lVar36 = lVar36 + -1;
      pbVar1 = (bool *)(pFVar28 + -1);
      pFVar28 = pFVar28 + -0x58;
      auVar43._0_16_ = ZEXT416((uint)(fVar45 + fVar47));
      auVar42._4_60_ = auVar43._4_60_;
      auVar42._0_4_ =
           (float)((uint)((*pbVar3 | *pbVar1) & 1) * (int)fVar45 +
                  (uint)!(bool)((*pbVar3 | *pbVar1) & 1) * (int)(fVar45 + fVar47));
      auVar43 = ZEXT1664(auVar42._0_16_);
      fVar45 = auVar42._0_4_;
    } while (1 < lVar36);
  }
  if (pFVar27 != (Float *)0x0) {
    *pFVar27 = FVar44;
  }
  if (local_398 != (Float *)0x0) {
    *local_398 = local_320;
  }
  if (pFVar34 != (Float *)0x0) {
    *pFVar34 = local_31c;
  }
  if (pFVar33 != (Float *)0x0) {
    *pFVar33 = local_318;
  }
  if (local_378 != (bool *)0x0) {
    *local_378 = (bool)local_2a8[0];
  }
  if (local_390 != (bool *)0x0) {
    *local_390 = (bool)local_3a0._0_1_;
  }
  if (pVVar32 != (Vertex *)0x0) {
    memcpy(pVVar32,local_148,0x118);
    (pVVar32->bsdf).bxdf.
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
    .bits = local_380;
    (pVVar32->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(undefined4)local_288;
    (pVVar32->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_288._4_4_;
    *(undefined8 *)&(pVVar32->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = uStack_280
    ;
    (pVVar32->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(undefined4)uStack_278;
    (pVVar32->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_278._4_4_;
    (pVVar32->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(undefined4)uStack_270;
    (pVVar32->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_270._4_4_;
    (pVVar32->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = local_39c;
    (pVVar32->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_340;
    (pVVar32->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)(CONCAT35(uStack_33b,local_340) >> 0x20);
    *(ulong *)((long)&(pVVar32->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) =
         CONCAT53(uStack_338,uStack_33b);
    pVVar32->field_0x153 = local_3a2;
    *(undefined2 *)&pVVar32->field_0x151 = local_3a4;
    uVar7 = vmovlps_avx(local_308);
    pVVar32->pdfFwd = (Float)(int)uVar7;
    pVVar32->pdfRev = (Float)(int)((ulong)uVar7 >> 0x20);
    *(undefined4 *)&pVVar32->field_0x15c = local_35c;
  }
  return 1.0 / (fVar45 + 1.0);
}

Assistant:

Float MISWeight(const Integrator &integrator, Vertex *lightVertices,
                Vertex *cameraVertices, Vertex &sampled, int s, int t,
                LightSamplerHandle lightSampler) {
    if (s + t == 2)
        return 1;
    Float sumRi = 0;
    // Define helper function _remap0_ that deals with Dirac delta functions
    auto remap0 = [](float f) -> Float { return f != 0 ? f : 1; };

    // Temporarily update vertex properties for current strategy
    // Look up connection vertices and their predecessors
    Vertex *qs = s > 0 ? &lightVertices[s - 1] : nullptr,
           *pt = t > 0 ? &cameraVertices[t - 1] : nullptr,
           *qsMinus = s > 1 ? &lightVertices[s - 2] : nullptr,
           *ptMinus = t > 1 ? &cameraVertices[t - 2] : nullptr;

    // Update sampled vertex for $s=1$ or $t=1$ strategy
    ScopedAssignment<Vertex> a1;
    if (s == 1)
        a1 = {qs, sampled};
    else if (t == 1)
        a1 = {pt, sampled};

    // Mark connection vertices as non-degenerate
    ScopedAssignment<bool> a2, a3;
    if (pt)
        a2 = {&pt->delta, false};
    if (qs)
        a3 = {&qs->delta, false};

    // Update reverse density of vertex $\pt{}_{t-1}$
    ScopedAssignment<Float> a4;
    if (pt)
        a4 = {&pt->pdfRev, s > 0 ? qs->PDF(integrator, qsMinus, *pt)
                                 : pt->PdfLightOrigin(integrator.infiniteLights, *ptMinus,
                                                      lightSampler)};

    // Update reverse density of vertex $\pt{}_{t-2}$
    ScopedAssignment<Float> a5;
    if (ptMinus)
        a5 = {&ptMinus->pdfRev, s > 0 ? pt->PDF(integrator, qs, *ptMinus)
                                      : pt->PdfLight(integrator, *ptMinus)};

    // Update reverse density of vertices $\pq{}_{s-1}$ and $\pq{}_{s-2}$
    ScopedAssignment<Float> a6;
    if (qs)
        a6 = {&qs->pdfRev, pt->PDF(integrator, ptMinus, *qs)};
    ScopedAssignment<Float> a7;
    if (qsMinus)
        a7 = {&qsMinus->pdfRev, qs->PDF(integrator, pt, *qsMinus)};

    // Consider hypothetical connection strategies along the camera subpath
    Float ri = 1;
    for (int i = t - 1; i > 0; --i) {
        ri *= remap0(cameraVertices[i].pdfRev) / remap0(cameraVertices[i].pdfFwd);
        if (!cameraVertices[i].delta && !cameraVertices[i - 1].delta)
            sumRi += ri;
    }

    // Consider hypothetical connection strategies along the light subpath
    ri = 1;
    for (int i = s - 1; i >= 0; --i) {
        ri *= remap0(lightVertices[i].pdfRev) / remap0(lightVertices[i].pdfFwd);
        bool deltaLightvertex =
            i > 0 ? lightVertices[i - 1].delta : lightVertices[0].IsDeltaLight();
        if (!lightVertices[i].delta && !deltaLightvertex)
            sumRi += ri;
    }

    return 1 / (1 + sumRi);
}